

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

EncounteredQmlMacro __thiscall Moc::parseClassInfo(Moc *this,BaseDef *def)

{
  QByteArrayView bv;
  bool bVar1;
  bool bVar2;
  EncounteredQmlMacro EVar3;
  qsizetype in_RSI;
  Parser *in_RDI;
  long in_FS_OFFSET;
  bool encounteredQmlMacro;
  ClassInfoDef infoDef;
  Symbol *in_stack_ffffffffffffff18;
  Token token;
  undefined4 in_stack_ffffffffffffff20;
  Token in_stack_ffffffffffffff24;
  Parser *pPVar4;
  Moc *in_stack_ffffffffffffff60;
  QTypeRevision local_92 [45];
  ClassInfoDef local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar4 = in_RDI;
  Parser::next((Parser *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (Token)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  memset(&local_38,0,0x30);
  local_38.name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.name.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_38.name.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.value.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.value.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_38.value.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  ClassInfoDef::ClassInfoDef
            ((ClassInfoDef *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  Parser::next((Parser *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (Token)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  Parser::symbol((Parser *)0x151735);
  Symbol::unquotedLexem(in_stack_ffffffffffffff18);
  QByteArray::operator=
            ((QByteArray *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (QByteArray *)in_stack_ffffffffffffff18);
  QByteArray::~QByteArray((QByteArray *)0x151767);
  QByteArrayView::QByteArrayView<5ul>((QByteArrayView *)&local_38,(char (*) [5])in_RDI);
  bv.m_data = (storage_type *)pPVar4;
  bv.m_size = in_RSI;
  bVar1 = QByteArray::startsWith((QByteArray *)in_RDI,bv);
  Parser::next((Parser *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (Token)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  bVar2 = Parser::test(in_RDI,in_stack_ffffffffffffff24);
  if (bVar2) {
    Parser::symbol((Parser *)0x1517db);
    Symbol::unquotedLexem(in_stack_ffffffffffffff18);
    QByteArray::operator=
              ((QByteArray *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (QByteArray *)in_stack_ffffffffffffff18);
    token = (Token)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    QByteArray::~QByteArray((QByteArray *)0x151808);
  }
  else {
    bVar2 = Parser::test(in_RDI,in_stack_ffffffffffffff24);
    if (bVar2) {
      local_92[0] = parseRevision(in_stack_ffffffffffffff60);
      QTypeRevision::toEncodedVersion<unsigned_short,_true>(local_92);
      QByteArray::number((int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      QByteArray::operator=
                ((QByteArray *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (QByteArray *)in_stack_ffffffffffffff18);
      token = (Token)((ulong)in_stack_ffffffffffffff18 >> 0x20);
      QByteArray::~QByteArray((QByteArray *)0x15186d);
    }
    else {
      Parser::next((Parser *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (Token)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      Parser::next((Parser *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (Token)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      Parser::next((Parser *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (Token)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      Parser::symbol((Parser *)0x1518a6);
      Symbol::unquotedLexem(in_stack_ffffffffffffff18);
      QByteArray::operator=
                ((QByteArray *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (QByteArray *)in_stack_ffffffffffffff18);
      token = (Token)((ulong)in_stack_ffffffffffffff18 >> 0x20);
      QByteArray::~QByteArray((QByteArray *)0x1518d3);
      Parser::next((Parser *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),token);
    }
  }
  Parser::next((Parser *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),token);
  QList<ClassInfoDef>::operator+=
            ((QList<ClassInfoDef> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             &local_38);
  EVar3 = (byte)~bVar1 & No;
  ClassInfoDef::~ClassInfoDef
            ((ClassInfoDef *)((ulong)CONCAT14(~bVar1,in_stack_ffffffffffffff20) & 0x1ffffffff));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return EVar3;
  }
  __stack_chk_fail();
}

Assistant:

Moc::EncounteredQmlMacro Moc::parseClassInfo(BaseDef *def)
{
    bool encounteredQmlMacro = false;
    next(LPAREN);
    ClassInfoDef infoDef;
    next(STRING_LITERAL);
    infoDef.name = symbol().unquotedLexem();
    if (infoDef.name.startsWith("QML."))
        encounteredQmlMacro = true;
    next(COMMA);
    if (test(STRING_LITERAL)) {
        infoDef.value = symbol().unquotedLexem();
    } else if (test(Q_REVISION_TOKEN)) {
        infoDef.value = QByteArray::number(parseRevision().toEncodedVersion<quint16>());
    } else {
        // support Q_CLASSINFO("help", QT_TR_NOOP("blah"))
        next(IDENTIFIER);
        next(LPAREN);
        next(STRING_LITERAL);
        infoDef.value = symbol().unquotedLexem();
        next(RPAREN);
    }
    next(RPAREN);
    def->classInfoList += infoDef;
    return encounteredQmlMacro ? EncounteredQmlMacro::Yes : EncounteredQmlMacro::No;
}